

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformpixmap.cpp
# Opt level: O0

void __thiscall
QPlatformPixmap::QPlatformPixmap(QPlatformPixmap *this,PixelType pixelType,int objectId)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__QPlatformPixmap_00e150e8;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined1 *)((long)in_RDI + 0x14) = 1;
  QAtomicInt::QAtomicInt((QAtomicInt *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RDI >> 0x20));
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 4) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x24) = in_EDX;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  return;
}

Assistant:

QPlatformPixmap::QPlatformPixmap(PixelType pixelType, int objectId)
    : w(0),
      h(0),
      d(0),
      is_null(true),
      ref(0),
      detach_no(0),
      type(pixelType),
      id(objectId),
      ser_no(0),
      is_cached(false)
{
}